

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O2

void __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::UpdateVariablesToIntegers
          (BinaryPolynomialModel<unsigned_int,_double> *this)

{
  pointer puVar1;
  ulong *puVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> _Stack_38;
  
  GenerateSortedVariables((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_38,this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&this->sorted_variables_,&_Stack_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&_Stack_38);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->variables_to_integers_)._M_h);
  lVar4 = 0;
  for (uVar3 = 0;
      puVar1 = (this->sorted_variables_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->sorted_variables_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar1 >> 2);
      uVar3 = uVar3 + 1) {
    puVar2 = (ulong *)std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_long>,_std::allocator<std::pair<const_unsigned_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&this->variables_to_integers_,
                                   (key_type *)((long)puVar1 + lVar4));
    *puVar2 = uVar3;
    lVar4 = lVar4 + 4;
  }
  this->relabel_flag_for_variables_to_integers_ = false;
  return;
}

Assistant:

void UpdateVariablesToIntegers() {
      sorted_variables_ = GenerateSortedVariables();
      variables_to_integers_.clear();
      for ( std::size_t i = 0; i < sorted_variables_.size(); ++i ) {
        variables_to_integers_[ sorted_variables_[ i ] ] = i;
      }
      relabel_flag_for_variables_to_integers_ = false;
    }